

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu580.c
# Opt level: O1

void vepu580_h265_set_hw_address(H265eV580HalContext *ctx,HalEncTask *task)

{
  MppBuffer *buffer;
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  anon_struct_4_12_9a467a88_for_reg0192_enc_pic aVar4;
  Vepu580H265eFrmCfg *pVVar5;
  H265eSyntax_new *pHVar6;
  H265eV580RegSet *pHVar7;
  MppEncCfgSet *pMVar8;
  MppDevRegOffCfgs *pMVar9;
  RK_U32 RVar10;
  HalBuf *pHVar11;
  HalBuf *pHVar12;
  size_t sVar13;
  long lVar14;
  MppBufferGroup *group;
  uint uVar15;
  
  pVVar5 = ctx->frm;
  pHVar6 = ctx->syn;
  pHVar7 = pVVar5->regs_set[0];
  if (((byte)hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v580","(%d) enter\n",(char *)0x0,0x996);
  }
  RVar10 = mpp_buffer_get_fd_with_caller(task->input,"vepu580_h265_set_hw_address");
  (pHVar7->reg_base).reg0160_adr_src0 = RVar10;
  (pHVar7->reg_base).reg0161_adr_src1 = RVar10;
  (pHVar7->reg_base).reg0162_adr_src2 = RVar10;
  pHVar11 = hal_bufs_get_buf(ctx->dpb_bufs,pVVar5->hal_curr_idx);
  pHVar12 = hal_bufs_get_buf(ctx->dpb_bufs,pVVar5->hal_refr_idx);
  if ((pHVar6->sp).non_reference_flag == 0) {
    RVar10 = mpp_buffer_get_fd_with_caller(*pHVar11->buf,"vepu580_h265_set_hw_address");
    (pHVar7->reg_base).reg0163_rfpw_h_addr = RVar10;
    (pHVar7->reg_base).reg0164_rfpw_b_addr = RVar10;
    mpp_dev_multi_offset_update(pVVar5->reg_cfg,0xa4,ctx->fbc_header_len);
  }
  RVar10 = mpp_buffer_get_fd_with_caller(*pHVar12->buf,"vepu580_h265_set_hw_address");
  (pHVar7->reg_base).reg0165_rfpr_h_addr = RVar10;
  (pHVar7->reg_base).reg0166_rfpr_b_addr = RVar10;
  RVar10 = mpp_buffer_get_fd_with_caller(pHVar11->buf[2],"vepu580_h265_set_hw_address");
  (pHVar7->reg_base).reg0167_cmvw_addr = RVar10;
  RVar10 = mpp_buffer_get_fd_with_caller(pHVar12->buf[2],"vepu580_h265_set_hw_address");
  (pHVar7->reg_base).reg0168_cmvr_addr = RVar10;
  RVar10 = mpp_buffer_get_fd_with_caller(pHVar11->buf[1],"vepu580_h265_set_hw_address");
  (pHVar7->reg_base).reg0169_dspw_addr = RVar10;
  RVar10 = mpp_buffer_get_fd_with_caller(pHVar12->buf[1],"vepu580_h265_set_hw_address");
  (pHVar7->reg_base).reg0170_dspr_addr = RVar10;
  mpp_dev_multi_offset_update(pVVar5->reg_cfg,0xa6,ctx->fbc_header_len);
  if (((uint)(pHVar6->pp).field_22 & 0x80) != 0) {
    bVar1 = (pHVar6->pp).num_tile_columns_minus1;
    bVar2 = (pHVar6->pp).num_tile_rows_minus1;
    uVar3 = (pHVar6->pp).pic_height;
    group = &ctx->tile_grp;
    if (ctx->tile_grp == (MppBufferGroup)0x0) {
      mpp_buffer_group_get
                (group,MPP_BUFFER_TYPE_ION,MPP_BUFFER_INTERNAL,"hal_h265e_v580",
                 "vepu580_h265_set_hw_address");
    }
    if ((*group == (MppBufferGroup)0x0) &&
       (_mpp_log_l(2,"hal_h265e_v580","Assertion %s failed at %s:%d\n",(char *)0x0,"ctx->tile_grp",
                   "vepu580_h265_set_hw_address",0x9b6), (mpp_debug._3_1_ & 0x10) != 0)) {
      abort();
    }
    uVar15 = (bVar2 + 1) * (bVar1 + 1);
    lVar14 = 0;
    do {
      if (*(long *)((long)pVVar5->hw_tile_buf + lVar14) == 0) {
        mpp_buffer_get_with_tag
                  (*group,(MppBuffer *)((long)pVVar5->hw_tile_buf + lVar14),
                   (ulong)(((uint)uVar3 * 0x20 + 0x7e0 & 0x3ff800) + 0x8ff & 0x7ff800),
                   "hal_h265e_v580","vepu580_h265_set_hw_address");
      }
      lVar14 = lVar14 + 8;
    } while (lVar14 != 0x20);
    if (pVVar5->hw_tile_stream[0] == (MppBuffer)0x0) {
      mpp_buffer_get_with_tag
                (ctx->tile_grp,pVVar5->hw_tile_stream,(ulong)ctx->frame_size / (ulong)uVar15,
                 "hal_h265e_v580","vepu580_h265_set_hw_address");
    }
    if (2 < uVar15) {
      if (pVVar5->hw_tile_stream[1] == (MppBuffer)0x0) {
        mpp_buffer_get_with_tag
                  (ctx->tile_grp,pVVar5->hw_tile_stream + 1,(ulong)ctx->frame_size / (ulong)uVar15,
                   "hal_h265e_v580","vepu580_h265_set_hw_address");
      }
      if (pVVar5->hw_tile_stream[2] == (MppBuffer)0x0) {
        mpp_buffer_get_with_tag
                  (ctx->tile_grp,pVVar5->hw_tile_stream + 2,(ulong)ctx->frame_size / (ulong)uVar15,
                   "hal_h265e_v580","vepu580_h265_set_hw_address");
      }
    }
    RVar10 = mpp_buffer_get_fd_with_caller(pVVar5->hw_tile_buf[0],"vepu580_h265_set_hw_address");
    (pHVar7->reg_base).reg0176_lpfw_addr = RVar10;
    RVar10 = mpp_buffer_get_fd_with_caller(pVVar5->hw_tile_buf[1],"vepu580_h265_set_hw_address");
    (pHVar7->reg_base).reg0177_lpfr_addr = RVar10;
  }
  if (task->md_info == (MppBuffer)0x0) {
    pMVar8 = ctx->cfg;
    if (((pMVar8->tune).deblur_en != 0) &&
       (uVar15 = ((pMVar8->prep).width + 0x3f >> 1 & 0xffffffe0U) *
                 ((pMVar8->prep).height + 0x3f >> 6), ctx->md_info_buf_size < (int)uVar15)) {
      buffer = &ctx->md_info_buf;
      if (ctx->md_info_buf != (MppBuffer)0x0) {
        mpp_buffer_put_with_caller(ctx->md_info_buf,"vepu580_h265_get_md_info_buf");
        *buffer = (MppBuffer)0x0;
      }
      if (ctx->qpmap_grp == (MppBufferGroup)0x0) {
        mpp_buffer_group_get
                  (&ctx->qpmap_grp,MPP_BUFFER_TYPE_ION,MPP_BUFFER_INTERNAL,"hal_h265e_v580",
                   "vepu580_h265_get_md_info_buf");
      }
      mpp_buffer_get_with_tag
                (ctx->qpmap_grp,buffer,(long)(int)uVar15,"hal_h265e_v580",
                 "vepu580_h265_get_md_info_buf");
      if (*buffer == (MppBuffer)0x0) {
        _mpp_log_l(2,"hal_h265e_v580","failed to get md info buffer\n",
                   "vepu580_h265_get_md_info_buf");
      }
      else {
        if (((byte)hal_h265e_debug & 4) != 0) {
          _mpp_log_l(4,"hal_h265e_v580","get md info internal buffer %p size %d %d\n",(char *)0x0,
                     *buffer,(ulong)uVar15,ctx->md_info_buf_size);
        }
        ctx->md_info_buf_size = uVar15;
      }
    }
    task->md_info = ctx->md_info_buf;
  }
  aVar4 = (pHVar7->reg_base).reg0192_enc_pic;
  if (task->md_info == (MppBuffer)0x0) {
    (pHVar7->reg_base).reg0192_enc_pic =
         (anon_struct_4_12_9a467a88_for_reg0192_enc_pic)((uint)aVar4 & 0xfffffff7);
    RVar10 = 0;
  }
  else {
    (pHVar7->reg_base).reg0192_enc_pic =
         (anon_struct_4_12_9a467a88_for_reg0192_enc_pic)((uint)aVar4 | 8);
    RVar10 = mpp_buffer_get_fd_with_caller(task->md_info,"vepu580_h265_set_hw_address");
  }
  (pHVar7->reg_base).reg0171_meiw_addr = RVar10;
  RVar10 = mpp_buffer_get_fd_with_caller(task->output,"vepu580_h265_set_hw_address");
  (pHVar7->reg_base).reg0172_bsbt_addr = RVar10;
  (pHVar7->reg_base).reg0173_bsbb_addr = RVar10;
  (pHVar7->reg_base).reg0174_bsbr_addr = RVar10;
  (pHVar7->reg_base).reg0175_adr_bsbs = RVar10;
  pMVar9 = pVVar5->reg_cfg;
  sVar13 = mpp_packet_get_length(task->packet);
  mpp_dev_multi_offset_update(pMVar9,0xaf,(RK_U32)sVar13);
  pMVar9 = pVVar5->reg_cfg;
  sVar13 = mpp_buffer_get_size_with_caller(task->output,"vepu580_h265_set_hw_address");
  mpp_dev_multi_offset_update(pMVar9,0xac,(RK_U32)sVar13);
  RVar10 = mpp_frame_get_offset_y(task->frame);
  (pHVar7->reg_base).reg0204_pic_ofst =
       (anon_struct_4_4_fd8500c5_for_reg0204_pic_ofst)
       ((uint)(pHVar7->reg_base).reg0204_pic_ofst & 0xc000ffff | (RVar10 & 0x3fff) << 0x10);
  RVar10 = mpp_frame_get_offset_x(task->frame);
  (pHVar7->reg_base).reg0204_pic_ofst =
       (anon_struct_4_4_fd8500c5_for_reg0204_pic_ofst)
       ((uint)(pHVar7->reg_base).reg0204_pic_ofst & 0xffffc000 | RVar10 & 0x3fff);
  return;
}

Assistant:

void vepu580_h265_set_hw_address(H265eV580HalContext *ctx, HalEncTask *task)
{
    Vepu580H265eFrmCfg *frm = ctx->frm;
    hevc_vepu580_base *regs = &frm->regs_set[0]->reg_base;
    HalEncTask *enc_task = task;
    HalBuf *recon_buf, *ref_buf;
    H265eSyntax_new *syn = ctx->syn;

    hal_h265e_enter();

    regs->reg0160_adr_src0     = mpp_buffer_get_fd(enc_task->input);
    regs->reg0161_adr_src1     = regs->reg0160_adr_src0;
    regs->reg0162_adr_src2     = regs->reg0160_adr_src0;

    recon_buf = hal_bufs_get_buf(ctx->dpb_bufs, frm->hal_curr_idx);
    ref_buf = hal_bufs_get_buf(ctx->dpb_bufs, frm->hal_refr_idx);

    if (!syn->sp.non_reference_flag) {
        regs->reg0163_rfpw_h_addr  = mpp_buffer_get_fd(recon_buf->buf[0]);
        regs->reg0164_rfpw_b_addr  = regs->reg0163_rfpw_h_addr;

        mpp_dev_multi_offset_update(frm->reg_cfg, 164, ctx->fbc_header_len);
    }
    regs->reg0165_rfpr_h_addr = mpp_buffer_get_fd(ref_buf->buf[0]);
    regs->reg0166_rfpr_b_addr = regs->reg0165_rfpr_h_addr;
    regs->reg0167_cmvw_addr = mpp_buffer_get_fd(recon_buf->buf[2]);
    regs->reg0168_cmvr_addr = mpp_buffer_get_fd(ref_buf->buf[2]);
    regs->reg0169_dspw_addr = mpp_buffer_get_fd(recon_buf->buf[1]);
    regs->reg0170_dspr_addr = mpp_buffer_get_fd(ref_buf->buf[1]);

    mpp_dev_multi_offset_update(frm->reg_cfg, 166, ctx->fbc_header_len);

    if (syn->pp.tiles_enabled_flag) {
        RK_U32 tile_num = (syn->pp.num_tile_columns_minus1 + 1) * (syn->pp.num_tile_rows_minus1 + 1);
        RK_U32 i = 0;
        RK_U32 max_tile_buf_size = MPP_ALIGN(((MPP_ALIGN(syn->pp.pic_height, 64) + 64) << 5), 256);

        if (NULL == ctx->tile_grp)
            mpp_buffer_group_get_internal(&ctx->tile_grp, MPP_BUFFER_TYPE_ION);

        mpp_assert(ctx->tile_grp);

        for (i = 0; i < MAX_TILE_NUM; i++) {
            if (NULL == frm->hw_tile_buf[i]) {
                mpp_buffer_get(ctx->tile_grp, &frm->hw_tile_buf[i], max_tile_buf_size);
            }
        }

        if (NULL == frm->hw_tile_stream[0]) {
            mpp_buffer_get(ctx->tile_grp, &frm->hw_tile_stream[0], ctx->frame_size / tile_num);
        }

        if (tile_num > 2) {
            if (NULL == frm->hw_tile_stream[1]) {
                mpp_buffer_get(ctx->tile_grp, &frm->hw_tile_stream[1], ctx->frame_size / tile_num);
            }
            if (NULL == frm->hw_tile_stream[2]) {
                mpp_buffer_get(ctx->tile_grp, &frm->hw_tile_stream[2], ctx->frame_size / tile_num);
            }
        }

        regs->reg0176_lpfw_addr  = mpp_buffer_get_fd(frm->hw_tile_buf[0]);
        regs->reg0177_lpfr_addr  = mpp_buffer_get_fd(frm->hw_tile_buf[1]);
    }

    {
        if (!enc_task->md_info)
            enc_task->md_info = vepu580_h265_get_md_info_buf(ctx);

        if (enc_task->md_info) {
            regs->reg0192_enc_pic.mei_stor    = 1;
            regs->reg0171_meiw_addr = mpp_buffer_get_fd(enc_task->md_info);
        } else {
            regs->reg0192_enc_pic.mei_stor    = 0;
            regs->reg0171_meiw_addr = 0;
        }
    }

    regs->reg0172_bsbt_addr = mpp_buffer_get_fd(enc_task->output);
    /* TODO: stream size relative with syntax */
    regs->reg0173_bsbb_addr = regs->reg0172_bsbt_addr;
    regs->reg0174_bsbr_addr = regs->reg0172_bsbt_addr;
    regs->reg0175_adr_bsbs  = regs->reg0172_bsbt_addr;

    mpp_dev_multi_offset_update(frm->reg_cfg, 175, mpp_packet_get_length(task->packet));
    mpp_dev_multi_offset_update(frm->reg_cfg, 172, mpp_buffer_get_size(enc_task->output));

    regs->reg0204_pic_ofst.pic_ofst_y = mpp_frame_get_offset_y(task->frame);
    regs->reg0204_pic_ofst.pic_ofst_x = mpp_frame_get_offset_x(task->frame);
}